

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

void Unr_ManTest(Gia_Man_t *pGia,int nFrames)

{
  abctime aVar1;
  Gia_Man_t *p;
  abctime aVar2;
  Gia_Man_t *p_00;
  abctime time;
  abctime time_00;
  
  aVar1 = Abc_Clock();
  p = Unr_ManUnroll(pGia,nFrames);
  aVar2 = Abc_Clock();
  Abc_PrintTime(0x824ccf,(char *)(aVar2 - aVar1),time);
  aVar1 = Abc_Clock();
  p_00 = Unr_ManUnrollSimple(pGia,nFrames);
  aVar2 = Abc_Clock();
  Abc_PrintTime(0x824cd7,(char *)(aVar2 - aVar1),time_00);
  Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  Gia_AigerWrite(p,"frames0.aig",0,0,0);
  Gia_AigerWrite(p_00,"frames1.aig",0,0,0);
  Gia_ManStop(p);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Unr_ManTest( Gia_Man_t * pGia, int nFrames )
{
    Gia_Man_t * pFrames0, * pFrames1;
    abctime clk = Abc_Clock();
    pFrames0 = Unr_ManUnroll( pGia, nFrames );
    Abc_PrintTime( 1, "Unroll ", Abc_Clock() - clk );
    clk = Abc_Clock();
    pFrames1 = Unr_ManUnrollSimple( pGia, nFrames );
    Abc_PrintTime( 1, "UnrollS", Abc_Clock() - clk );

Gia_ManPrintStats( pFrames0, NULL );
Gia_ManPrintStats( pFrames1, NULL );
Gia_AigerWrite( pFrames0, "frames0.aig", 0, 0, 0 );
Gia_AigerWrite( pFrames1, "frames1.aig", 0, 0, 0 );

    Gia_ManStop( pFrames0 );
    Gia_ManStop( pFrames1 );
}